

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::CollationBuilder::suppressContractions
          (CollationBuilder *this,UnicodeSet *set,char **parserErrorReason,UErrorCode *errorCode)

{
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  CollationDataBuilder::suppressContractions(this->dataBuilder,set,errorCode);
  if (U_ZERO_ERROR < *errorCode) {
    *parserErrorReason = "application of [suppressContractions [set]] failed";
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }